

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O3

psa_status_t
psa_export_key(psa_key_handle_t handle,uint8_t *data,size_t data_size,size_t *data_length)

{
  psa_status_t pVar1;
  psa_key_slot_t *slot;
  psa_key_slot_t *local_20;
  
  *data_length = 0;
  pVar1 = psa_get_key_from_slot(handle,&local_20,1,0);
  if (pVar1 != 0) {
    return pVar1;
  }
  pVar1 = psa_internal_export_key(local_20,data,data_size,data_length,0);
  return pVar1;
}

Assistant:

psa_status_t psa_export_key( psa_key_handle_t handle,
                             uint8_t *data,
                             size_t data_size,
                             size_t *data_length )
{
    psa_key_slot_t *slot;
    psa_status_t status;

    /* Set the key to empty now, so that even when there are errors, we always
     * set data_length to a value between 0 and data_size. On error, setting
     * the key to empty is a good choice because an empty key representation is
     * unlikely to be accepted anywhere. */
    *data_length = 0;

    /* Export requires the EXPORT flag. There is an exception for public keys,
     * which don't require any flag, but psa_get_key_from_slot takes
     * care of this. */
    status = psa_get_key_from_slot( handle, &slot, PSA_KEY_USAGE_EXPORT, 0 );
    if( status != PSA_SUCCESS )
        return( status );
    return( psa_internal_export_key( slot, data, data_size,
                                     data_length, 0 ) );
}